

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDirPrivate::QDirPrivate(QDirPrivate *this,QDirPrivate *copy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_RSI;
  atomic<bool> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  FileCache *in_stack_ffffffffffffffd0;
  QFileSystemEntry *this_00;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedData::QSharedData
            ((QSharedData *)in_stack_ffffffffffffffd0,
             (QSharedData *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  QList<QString>::QList
            ((QList<QString> *)in_stack_ffffffffffffffd0,
             (QList<QString> *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RSI + 0x24);
  std::unique_ptr<QAbstractFileEngine,std::default_delete<QAbstractFileEngine>>::
  unique_ptr<std::default_delete<QAbstractFileEngine>,void>
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
             in_stack_ffffffffffffffd0);
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)in_stack_ffffffffffffffd0,
             (QFileSystemEntry *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  FileCache::FileCache(in_stack_ffffffffffffffd0);
  local_9 = 0xaa;
  this_00 = (QFileSystemEntry *)&stack0xfffffffffffffff7;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)this_00,(QMutex *)(in_RSI + 0x68));
  std::atomic<bool>::load(in_RDI,(memory_order)((ulong)this_00 >> 0x20));
  std::atomic<bool>::operator=((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffffcf);
  QList<QString>::operator=
            ((QList<QString> *)this_00,
             (QList<QString> *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  QList<QFileInfo>::operator=
            ((QList<QFileInfo> *)this_00,
             (QList<QFileInfo> *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  QFileSystemEntry::operator=
            (this_00,(QFileSystemEntry *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  *(undefined8 *)(in_RDI + 0x110) = *(undefined8 *)(in_RSI + 0x110);
  uVar1 = *(undefined8 *)(in_RSI + 0xe0);
  uVar2 = *(undefined8 *)(in_RSI + 0xe8);
  uVar3 = *(undefined8 *)(in_RSI + 0xf0);
  uVar4 = *(undefined8 *)(in_RSI + 0xf8);
  uVar5 = *(undefined8 *)(in_RSI + 0x108);
  *(undefined8 *)(in_RDI + 0x100) = *(undefined8 *)(in_RSI + 0x100);
  *(undefined8 *)(in_RDI + 0x108) = uVar5;
  *(undefined8 *)(in_RDI + 0xf0) = uVar3;
  *(undefined8 *)(in_RDI + 0xf8) = uVar4;
  *(undefined8 *)(in_RDI + 0xe0) = uVar1;
  *(undefined8 *)(in_RDI + 0xe8) = uVar2;
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirPrivate::QDirPrivate(const QDirPrivate &copy)
    : QSharedData(copy),
      // mutex is not copied
      nameFilters(copy.nameFilters),
      sort(copy.sort),
      filters(copy.filters),
      // fileEngine is not copied
      dirEntry(copy.dirEntry)
{
    QMutexLocker locker(&copy.fileCache.mutex);
    fileCache.fileListsInitialized = copy.fileCache.fileListsInitialized.load();
    fileCache.files = copy.fileCache.files;
    fileCache.fileInfos = copy.fileCache.fileInfos;
    fileCache.absoluteDirEntry = copy.fileCache.absoluteDirEntry;
    fileCache.metaData = copy.fileCache.metaData;
}